

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Runner2::makeReporter(Runner2 *this)

{
  size_type sVar1;
  pointer pcVar2;
  ConfigData *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  IRegistryHub *pIVar5;
  undefined4 extraout_var_00;
  IReporter *p;
  ostream *poVar6;
  domain_error *this_00;
  ReporterConfig reporterConfig;
  ostringstream oss;
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  string local_2a8 [32];
  ReporterConfig local_288;
  ostringstream local_198 [376];
  
  sVar1 = (this->m_config->reporter)._M_string_length;
  local_2c8 = local_2b8;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"basic","");
  }
  else {
    pcVar2 = (this->m_config->reporter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2c8,pcVar2,pcVar2 + sVar1);
  }
  pCVar3 = this->m_config;
  iVar4 = (*(this->m_configWrapper->super_IConfig)._vptr_IConfig[4])();
  ReporterConfig::ReporterConfig
            (&local_288,&pCVar3->name,(ostream *)CONCAT44(extraout_var,iVar4),
             this->m_config->includeWhichResults == SuccessfulResults,this->m_config);
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
  p = (IReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                ((long *)CONCAT44(extraout_var_00,iVar4),&local_2c8,&local_288);
  Ptr<Catch::IReporter>::operator=(&this->m_reporter,p);
  if ((this->m_reporter).m_p != (IReporter *)0x0) {
    ReporterConfig::~ReporterConfig(&local_288);
    if (local_2c8 != local_2b8) {
      operator_delete(local_2c8,local_2b8[0] + 1);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"No reporter registered with name: \'",0x23);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_2c8,local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,local_2a8);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config.reporter.empty()
            ? "basic"
            : m_config.reporter;

            ReporterConfig reporterConfig( m_config.name, m_configWrapper.stream(), m_config.includeWhichResults == Include::SuccessfulResults, m_config );

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, reporterConfig );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }